

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitDelegate(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index label)

{
  __index_type *__return_storage_ptr___00;
  size_type sVar1;
  reference this_00;
  Try *pTVar2;
  Name *pNVar3;
  Function *pFVar4;
  ulong uVar5;
  bool bVar6;
  allocator<char> local_119;
  Err local_118;
  uint local_f4;
  Err local_f0;
  Err *local_d0;
  Err *err;
  Result<wasm::Name> _val;
  Result<wasm::Name> delegateName;
  value_type *delegateScope;
  size_t size;
  allocator<char> local_51;
  Err local_50;
  Try *local_30;
  Try *tryy;
  ScopeCtx *scope;
  IRBuilder *pIStack_18;
  Index label_local;
  IRBuilder *this_local;
  
  scope._4_4_ = label;
  pIStack_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  tryy = (Try *)getScope(this);
  local_30 = ScopeCtx::getTry((ScopeCtx *)tryy);
  if (local_30 == (Try *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"unexpected delegate",&local_51);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else {
    scope._4_4_ = scope._4_4_ + 1;
    sVar1 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::size
                      (&this->scopeStack);
    for (; scope._4_4_ < sVar1; scope._4_4_ = scope._4_4_ + 1) {
      this_00 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
                operator[](&this->scopeStack,(sVar1 - scope._4_4_) - 1);
      pTVar2 = ScopeCtx::getTry(this_00);
      if (pTVar2 != (Try *)0x0) {
        __return_storage_ptr___00 =
             (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
        getDelegateLabelName((Result<wasm::Name> *)__return_storage_ptr___00,this,scope._4_4_);
        Result<wasm::Name>::Result
                  ((Result<wasm::Name> *)&err,(Result<wasm::Name> *)__return_storage_ptr___00);
        local_d0 = Result<wasm::Name>::getErr((Result<wasm::Name> *)&err);
        bVar6 = local_d0 != (Err *)0x0;
        if (bVar6) {
          wasm::Err::Err(&local_f0,local_d0);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
          wasm::Err::~Err(&local_f0);
        }
        local_f4 = (uint)bVar6;
        Result<wasm::Name>::~Result((Result<wasm::Name> *)&err);
        if (local_f4 == 0) {
          pNVar3 = Result<wasm::Name>::operator*
                             ((Result<wasm::Name> *)
                              ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
          wasm::Name::operator=(&local_30->delegateTarget,pNVar3);
          local_f4 = 2;
        }
        Result<wasm::Name>::~Result
                  ((Result<wasm::Name> *)
                   ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        if (local_f4 == 1) {
          return __return_storage_ptr__;
        }
        break;
      }
      pFVar4 = ScopeCtx::getFunction(this_00);
      if (pFVar4 != (Function *)0x0) {
        wasm::Name::operator=(&local_30->delegateTarget,(Name *)&DELEGATE_CALLER_TARGET);
        break;
      }
    }
    uVar5 = (ulong)scope._4_4_;
    sVar1 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::size
                      (&this->scopeStack);
    if (uVar5 == sVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"unexpected delegate",&local_119);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_118);
      wasm::Err::~Err(&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      visitEnd(__return_storage_ptr__,this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitDelegate(Index label) {
  auto& scope = getScope();
  auto* tryy = scope.getTry();
  if (!tryy) {
    return Err{"unexpected delegate"};
  }
  // In Binaryen IR, delegates can only target try or function scopes directly.
  // Search upward to find the nearest enclosing try or function scope. Since
  // the given label is relative the parent scope of the try, start by adjusting
  // it to be relative to the try scope.
  ++label;
  for (size_t size = scopeStack.size(); label < size; ++label) {
    auto& delegateScope = scopeStack[size - label - 1];
    if (delegateScope.getTry()) {
      auto delegateName = getDelegateLabelName(label);
      CHECK_ERR(delegateName);
      tryy->delegateTarget = *delegateName;
      break;
    } else if (delegateScope.getFunction()) {
      tryy->delegateTarget = DELEGATE_CALLER_TARGET;
      break;
    }
  }
  if (label == scopeStack.size()) {
    return Err{"unexpected delegate"};
  }
  // Delegate ends the try.
  return visitEnd();
}